

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_decoder.c
# Opt level: O2

lzma_ret lzma_vli_decode(lzma_vli *vli,size_t *vli_pos,uint8_t *in,size_t *in_pos,size_t in_size)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  lzma_vli lVar7;
  ulong uVar8;
  ulong local_38;
  
  if (vli_pos == (size_t *)0x0) {
    *vli = 0;
    uVar2 = *in_pos;
    if (in_size <= uVar2) {
      return LZMA_DATA_ERROR;
    }
    lVar7 = 0;
    uVar4 = 0;
    vli_pos = &local_38;
  }
  else {
    uVar4 = *vli_pos;
    if (uVar4 == 0) {
      *vli = 0;
      lVar7 = 0;
    }
    else {
      if (8 < uVar4) {
        return LZMA_PROG_ERROR;
      }
      lVar7 = *vli;
    }
    if (lVar7 >> ((char)uVar4 * '\a' & 0x3fU) != 0) {
      return LZMA_PROG_ERROR;
    }
    uVar2 = *in_pos;
    if (in_size <= uVar2) {
      return LZMA_BUF_ERROR;
    }
  }
  uVar8 = uVar2 + 1;
  if (uVar2 + 1 < in_size) {
    uVar8 = in_size;
  }
  lVar3 = uVar4 * 7;
  lVar5 = 0;
  while( true ) {
    bVar1 = in[lVar5 + uVar2];
    lVar7 = ((ulong)(bVar1 & 0x7f) << ((byte)lVar3 & 0x3f)) + lVar7;
    uVar6 = uVar2 + lVar5 + 1;
    if (-1 < (char)bVar1) {
      *in_pos = uVar6;
      uVar2 = uVar4 + 1 + lVar5;
      *vli_pos = uVar2;
      *vli = lVar7;
      if (bVar1 != 0 || uVar2 < 2) {
        return (uint)(vli_pos != &local_38);
      }
      return LZMA_DATA_ERROR;
    }
    if (uVar4 + lVar5 == 8) break;
    lVar3 = lVar3 + 7;
    lVar5 = lVar5 + 1;
    if (in_size <= uVar6) {
      *in_pos = uVar8;
      *vli_pos = uVar4 + lVar5;
      *vli = lVar7;
      return (uint)(vli_pos == &local_38) * 9;
    }
  }
  *in_pos = uVar6;
  *vli_pos = 9;
  *vli = lVar7;
  return LZMA_DATA_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_vli_decode(lzma_vli *LZMA_RESTRICT vli, size_t *vli_pos,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size)
{
	// If we haven't been given vli_pos, work in single-call mode.
	size_t vli_pos_internal = 0;
	if (vli_pos == NULL) {
		vli_pos = &vli_pos_internal;
		*vli = 0;

		// If there's no input, use LZMA_DATA_ERROR. This way it is
		// easy to decode VLIs from buffers that have known size,
		// and get the correct error code in case the buffer is
		// too short.
		if (*in_pos >= in_size)
			return LZMA_DATA_ERROR;

	} else {
		// Initialize *vli when starting to decode a new integer.
		if (*vli_pos == 0)
			*vli = 0;

		// Validate the arguments.
		if (*vli_pos >= LZMA_VLI_BYTES_MAX
				|| (*vli >> (*vli_pos * 7)) != 0)
			return LZMA_PROG_ERROR;;

		if (*in_pos >= in_size)
			return LZMA_BUF_ERROR;
	}

	do {
		// Read the next byte. Use a temporary variable so that we
		// can update *in_pos immediately.
		const uint8_t byte = in[*in_pos];
		++*in_pos;

		// Add the newly read byte to *vli.
		*vli += (lzma_vli)(byte & 0x7F) << (*vli_pos * 7);
		++*vli_pos;

		// Check if this is the last byte of a multibyte integer.
		if ((byte & 0x80) == 0) {
			// We don't allow using variable-length integers as
			// padding i.e. the encoding must use the most the
			// compact form.
			if (byte == 0x00 && *vli_pos > 1)
				return LZMA_DATA_ERROR;

			return vli_pos == &vli_pos_internal
					? LZMA_OK : LZMA_STREAM_END;
		}

		// There is at least one more byte coming. If we have already
		// read maximum number of bytes, the integer is considered
		// corrupt.
		//
		// If we need bigger integers in future, old versions liblzma
		// will confusingly indicate the file being corrupt istead of
		// unsupported. I suppose it's still better this way, because
		// in the foreseeable future (writing this in 2008) the only
		// reason why files would appear having over 63-bit integers
		// is that the files are simply corrupt.
		if (*vli_pos == LZMA_VLI_BYTES_MAX)
			return LZMA_DATA_ERROR;

	} while (*in_pos < in_size);

	return vli_pos == &vli_pos_internal ? LZMA_DATA_ERROR : LZMA_OK;
}